

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.cpp
# Opt level: O0

void __thiscall slang::ast::ScriptSession::evalStatement(ScriptSession *this,StatementSyntax *stmt)

{
  LookupLocation lookupLocation;
  StatementBlockSymbol *this_00;
  Scope *scope;
  EvalContext *in_RDI;
  StatementContext stmtCtx;
  ASTContext context;
  StatementBlockSymbol *block;
  Scope *in_stack_ffffffffffffff30;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffff40;
  Scope *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  StatementContext *in_stack_ffffffffffffff70;
  bitmask<slang::ast::ASTFlags> local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  StatementSyntax *in_stack_ffffffffffffffa8;
  not_null<const_slang::ast::Scope_*> in_stack_ffffffffffffffb0;
  RandomizeDetails *in_stack_ffffffffffffffd8;
  AssertionInstanceDetails *in_stack_ffffffffffffffe0;
  
  this_00 = StatementBlockSymbol::fromLabeledStmt
                      (in_stack_ffffffffffffffb0.ptr,in_stack_ffffffffffffffa8);
  Scope::addMember(in_stack_ffffffffffffff30,(Symbol *)in_RDI);
  scope = (Scope *)(*(long *)(in_RDI[3].warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                              super_SmallVectorBase<slang::Diagnostic>.firstElement + 0x40) + 0x40);
  local_68 = LookupLocation::max;
  uStack_60 = DAT_00d8a540;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_70,None);
  lookupLocation._8_8_ = in_stack_ffffffffffffff50;
  lookupLocation.scope = in_stack_ffffffffffffff48;
  ASTContext::ASTContext
            ((ASTContext *)&stack0xffffffffffffffb0,scope,lookupLocation,in_stack_ffffffffffffff40);
  Statement::StatementContext::StatementContext((StatementContext *)scope,&in_RDI->astCtx);
  StatementBlockSymbol::getStatement
            (this_00,(ASTContext *)in_stack_ffffffffffffffe0,
             (StatementContext *)in_stack_ffffffffffffffd8);
  Statement::eval((Statement *)scope,in_RDI);
  Statement::StatementContext::~StatementContext(in_stack_ffffffffffffff70);
  return;
}

Assistant:

void ScriptSession::evalStatement(const StatementSyntax& stmt) {
    auto& block = StatementBlockSymbol::fromLabeledStmt(scope, stmt);
    scope.addMember(block);

    ASTContext context(scope, LookupLocation::max);
    Statement::StatementContext stmtCtx(context);
    block.getStatement(context, stmtCtx).eval(evalContext);
}